

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O0

bool __thiscall wasm::StackIROptimizer::isControlFlowBegin(StackIROptimizer *this,StackInst *inst)

{
  Op OVar1;
  StackInst *inst_local;
  StackIROptimizer *this_local;
  
  OVar1 = inst->op;
  if ((((OVar1 == BlockBegin) || (OVar1 == IfBegin)) || (OVar1 == LoopBegin)) ||
     ((OVar1 == TryBegin || (OVar1 == TryTableBegin)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StackIROptimizer::isControlFlowBegin(StackInst* inst) {
  switch (inst->op) {
    case StackInst::BlockBegin:
    case StackInst::IfBegin:
    case StackInst::LoopBegin:
    case StackInst::TryBegin:
    case StackInst::TryTableBegin: {
      return true;
    }
    default: {
      return false;
    }
  }
}